

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::HDivDirections
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,TPZVec<double> *pt,
          TPZFMatrix<Fad<double>_> *directions)

{
  TPZVec<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZFNMatrix<9,_Fad<double>_> gradxFad;
  int j;
  int i;
  TPZManVector<Fad<double>,_10> qsiFad;
  TPZFNMatrix<9,_double> gradxinv;
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<Fad<double>_> *in_stack_00000e58;
  TPZFMatrix<Fad<double>_> *in_stack_00000e60;
  undefined4 in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  Fad<double> *in_stack_fffffffffffffa40;
  double *in_stack_fffffffffffffa48;
  double dVar1;
  TPZManVector<Fad<double>,_10> *in_stack_fffffffffffffa50;
  double *in_stack_fffffffffffffa58;
  TPZFMatrix<double> *in_stack_fffffffffffffa60;
  double *in_stack_fffffffffffffa68;
  DecomposeType dec;
  TPZMatrix<double> *this_00;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffa80;
  int64_t in_stack_fffffffffffffa90;
  int64_t in_stack_fffffffffffffa98;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffffaa0;
  int64_t in_stack_fffffffffffffaa8;
  int64_t in_stack_fffffffffffffab0;
  TPZFMatrix<double> *in_stack_fffffffffffffab8;
  Fad<double> *in_stack_fffffffffffffae0;
  int64_t in_stack_fffffffffffffae8;
  TPZManVector<Fad<double>,_10> *in_stack_fffffffffffffaf0;
  int local_3ac;
  int local_384;
  TPZVec<Fad<double>_> local_358 [11];
  undefined8 local_1e8;
  undefined8 local_100;
  undefined1 local_f8 [232];
  TPZVec<double> *local_10;
  
  local_100 = 0;
  this_00 = (TPZMatrix<double> *)0x3;
  local_10 = in_RSI;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffa80,3,(int64_t)in_RDI,in_stack_fffffffffffffa68);
  local_1e8 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffffa80,(int64_t)this_00,(int64_t)in_RDI,in_stack_fffffffffffffa68);
  dec = (DecomposeType)((ulong)in_stack_fffffffffffffa68 >> 0x20);
  (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x46])
            (in_RDI,local_10,local_f8);
  TPZFMatrix<double>::Resize
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  TPZMatrix<double>::Inverse(this_00,in_RDI,dec);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  Fad<double>::~Fad(in_stack_fffffffffffffa40);
  for (local_384 = 0; local_384 < 3; local_384 = local_384 + 1) {
    TPZVec<double>::operator[](local_10,(long)local_384);
    Fad<double>::Fad((Fad<double> *)in_stack_fffffffffffffa60,
                     (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),
                     (double *)in_stack_fffffffffffffa50);
    in_stack_fffffffffffffa60 =
         (TPZFMatrix<double> *)TPZVec<Fad<double>_>::operator[](local_358,(long)local_384);
    Fad<double>::operator=
              (in_stack_fffffffffffffa40,
               (Fad<double> *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    Fad<double>::~Fad(in_stack_fffffffffffffa40);
    for (local_3ac = 0; local_3ac < 3; local_3ac = local_3ac + 1) {
      in_stack_fffffffffffffa58 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffa60,(int64_t)in_stack_fffffffffffffa58,
                      (int64_t)in_stack_fffffffffffffa50);
      dVar1 = *in_stack_fffffffffffffa58;
      in_stack_fffffffffffffa50 =
           (TPZManVector<Fad<double>,_10> *)
           TPZVec<Fad<double>_>::operator[](local_358,(long)local_384);
      in_stack_fffffffffffffa40 =
           (Fad<double> *)
           Fad<double>::fastAccessDx(in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c);
      in_stack_fffffffffffffa40->val_ = dVar1;
    }
  }
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x48])
            (in_RDI,local_358,&stack0xfffffffffffffa80);
  pztopology::TPZPrism::ComputeHDivDirections<Fad<double>>(in_stack_00000e60,in_stack_00000e58);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x16d1b5d);
  TPZManVector<Fad<double>,_10>::~TPZManVector(in_stack_fffffffffffffa50);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16d1b77);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16d1b84);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirections(TPZVec<REAL> &pt, TPZFMatrix<Fad<REAL>> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.),gradxinv(TGeo::Dimension,TGeo::Dimension,0.);
    
    this->GradX(pt, gradx);
    gradx.Resize(TGeo::Dimension,TGeo::Dimension);
    gradx.Inverse(gradxinv, ENoDecompose);
    
    TPZManVector<Fad<REAL>> qsiFad(TGeo::Dimension,0.);
    
    for(int i=0;i<TGeo::Dimension;i++){
        qsiFad[i] = Fad<REAL>(TGeo::Dimension,pt[i]);

        for(int j=0;j<TGeo::Dimension;j++){
            qsiFad[i].fastAccessDx(j)=gradxinv(i,j);
        }
    }
    //std::cout<<qsiFad<<std::endl;
    TPZFNMatrix<9,Fad<REAL>> gradxFad(3,TGeo::Dimension);
    this->GradX(qsiFad, gradxFad);
    //gradxFad.Print(std::cout);
    TGeo::ComputeHDivDirections(gradxFad, directions);
   
}